

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O3

void (anonymous_namespace)::
     assertValuesInOrder<slang::SmallVector<(anonymous_namespace)::Constructable,9ul>,int>
               (SmallVector<(anonymous_namespace)::Constructable,_9UL> *v,int *args)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  StringRef capturedExpression;
  StringRef macroName;
  AssertionHandler catchAssertionHandler;
  ITransientExpression local_68;
  AssertionHandler local_58;
  
  local_68._vptr_ITransientExpression = (_func_int **)0xa004f0;
  local_68.m_isBinaryExpression = true;
  local_68.m_result = false;
  local_68._10_6_ = 0;
  capturedExpression.m_size = 0x36;
  capturedExpression.m_start = "std::ranges::equal(v, a, {}, &Constructable::getValue)";
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_58,macroName,(SourceLineInfo *)&local_68,capturedExpression,ContinueOnFailure);
  if ((v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len == 1) {
    iVar1 = ((v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).data_)->value;
    iVar2 = -iVar1;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
    bVar3 = iVar2 == (int)args;
  }
  else {
    bVar3 = false;
  }
  local_68._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00c896a0;
  local_68._8_8_ = (ulong)CONCAT52(local_68._11_5_,CONCAT11(bVar3,bVar3)) << 8;
  Catch::AssertionHandler::handleExpr(&local_58,&local_68);
  Catch::AssertionHandler::complete(&local_58);
  if (local_58.m_completed == false) {
    (*(local_58.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  return;
}

Assistant:

void assertValuesInOrder(TVector& v, TArgs&&... args) {
    auto a = std::array{std::forward<TArgs>(args)...};
    CHECK(std::ranges::equal(v, a, {}, &Constructable::getValue));
}